

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.cpp
# Opt level: O3

void __thiscall session::on_writable(session *this)

{
  buffer *this_00;
  socket_t fd;
  int iVar1;
  uint uVar2;
  char *data;
  
  if (this->closed_ == false) {
    this_00 = &this->sendbuf_;
    do {
      iVar1 = buffer::size(this_00);
      if (iVar1 < 1) break;
      fd = this->fd_;
      data = buffer::data(this_00);
      iVar1 = buffer::size(this_00);
      iVar1 = send_data(fd,data,iVar1);
      if (iVar1 < 0) {
        uVar2 = get_network_err();
        if (uVar2 != 0) {
          (*this->manager_->_vptr_imanager[1])
                    (this->manager_,(ulong)(uint)(this->super_iobject).netid_,(ulong)uVar2);
LAB_00105afe:
          (*(this->network_->super_inetwork)._vptr_inetwork[5])
                    (this->network_,(ulong)(uint)(this->super_iobject).netid_);
          return;
        }
        break;
      }
      if (iVar1 == 0) {
        (*this->manager_->_vptr_imanager[1])
                  (this->manager_,(ulong)(uint)(this->super_iobject).netid_,0);
        goto LAB_00105afe;
      }
      buffer::pop_data(this_00,iVar1);
    } while (this->closed_ != true);
  }
  iVar1 = buffer::size(&this->sendbuf_);
  if (iVar1 < 1) {
    buffer::shrink(&this->sendbuf_);
    network::del_event(this->network_,&this->super_iobject,this->fd_,4);
    return;
  }
  return;
}

Assistant:

void session::on_writable()
{
    while (!closed_ && sendbuf_.size() > 0)
    {
        int send_len = send_data(fd_, sendbuf_.data(), sendbuf_.size());
        if (send_len < 0)
        {
            int error = get_network_err();
            if (error != 0)
            {
                on_error(error);
                return;
            }
            break;
        }

        if (send_len == 0)
        {
            on_error(0);
            return;
        }

        sendbuf_.pop_data(send_len);
    }

    if (sendbuf_.size() <= 0)
    {
        sendbuf_.shrink();
        network_->del_event(this, fd_, EVENT_WRITE);
    }
}